

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O0

bool adiak::internal::parse<adiak::catstring>::make_value
               (catstring *obj,adiak_value_t *val,adiak_datatype_t *param_3)

{
  catstring local_40;
  adiak_datatype_t *local_20;
  adiak_datatype_t *param_2_local;
  adiak_value_t *val_local;
  catstring *obj_local;
  
  local_20 = param_3;
  param_2_local = (adiak_datatype_t *)val;
  val_local = (adiak_value_t *)obj;
  catstring::catstring(&local_40,obj);
  element_type<adiak::catstring>::set(val,&local_40);
  catstring::~catstring(&local_40);
  return true;
}

Assistant:

static bool make_value(T &obj, adiak_value_t *val, adiak_datatype_t *) {
            element_type<T>::set(*val, obj);
            return true;
         }